

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::process_stmt(Simulator *this,IfStmt *if_,Var *var)

{
  bool *this_00;
  bool bVar1;
  element_type *var_00;
  unsigned_long *puVar2;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  StmtBlock *pSVar4;
  optional<unsigned_long> oVar5;
  shared_ptr<kratos::ScopedStmtBlock> *else_;
  shared_ptr<kratos::ScopedStmtBlock> *then_;
  _Storage<unsigned_long,_true> local_40;
  optional<unsigned_long> val;
  shared_ptr<kratos::Var> target;
  Var *var_local;
  IfStmt *if__local;
  Simulator *this_local;
  
  this_00 = &val.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  IfStmt::predicate((IfStmt *)this_00);
  var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)this_00);
  oVar5 = get_value_(this,var_00);
  local_40._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  val.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_40);
  if ((bVar1) &&
     (puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_40),
     *puVar2 != 0)) {
    p_Var3 = &IfStmt::then_body(if_)->
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
    pSVar4 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(p_Var3)->
              super_StmtBlock;
    process_stmt(this,pSVar4,var);
  }
  else {
    p_Var3 = &IfStmt::else_body(if_)->
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
    pSVar4 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(p_Var3)->
              super_StmtBlock;
    process_stmt(this,pSVar4,var);
  }
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &val.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  return;
}

Assistant:

void Simulator::process_stmt(kratos::IfStmt *if_, const Var *var) {
    auto target = if_->predicate();
    auto val = get_value_(target.get());
    if (val && (*val)) {
        auto const &then_ = if_->then_body();
        process_stmt(then_.get(), var);
    } else {
        auto const &else_ = if_->else_body();
        process_stmt(else_.get(), var);
    }
}